

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.hpp
# Opt level: O2

void __thiscall antlr::CommonToken::CommonToken(CommonToken *this,int t,string *txt)

{
  (this->super_Token).ref = (TokenRef *)0x0;
  (this->super_Token).type = t;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__CommonToken_002c43f0;
  *(undefined8 *)&(this->super_Token).field_0x14 = 0x100000001;
  std::__cxx11::string::string((string *)&this->text,(string *)txt);
  return;
}

Assistant:

Token(int t)
	: ref(0)
	, type(t)
	{
	}